

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupAppendCones(Gia_Man_t *p,Gia_Man_t **ppCones,int nCones,int fOnlyRegs)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  int iVar8;
  uint uVar9;
  Gia_Man_t *p_00;
  size_t sVar10;
  char *pcVar11;
  Vec_Int_t *pVVar12;
  Gia_Obj_t *pGVar13;
  Gia_Man_t *pGVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar3);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar3);
  }
  p_00->pName = pcVar11;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar3);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar3);
  }
  p_00->pSpec = pcVar11;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  pVVar12 = p->vCis;
  if (0 < pVVar12->nSize) {
    lVar18 = 0;
    do {
      iVar8 = pVVar12->pArray[lVar18];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_001dab33;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar13 = Gia_ManAppendObj(p_00);
      uVar20 = *(ulong *)pGVar13;
      *(ulong *)pGVar13 = uVar20 | 0x9fffffff;
      *(ulong *)pGVar13 =
           uVar20 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p_00->pObjs;
      if ((pGVar13 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar13)) {
LAB_001dab90:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar13 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar13)) goto LAB_001dab90;
      pGVar4[iVar8].Value = (int)((ulong)((long)pGVar13 - (long)pGVar5) >> 2) * 0x55555556;
      lVar18 = lVar18 + 1;
      pVVar12 = p->vCis;
    } while (lVar18 < pVVar12->nSize);
  }
  iVar8 = p->nObjs;
  if (0 < iVar8) {
    lVar19 = 8;
    lVar18 = 0;
    do {
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar20 = *(ulong *)((long)pGVar4 + lVar19 + -8);
      if ((uVar20 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar20) {
        uVar9 = *(uint *)((long)pGVar4 +
                         lVar19 + (ulong)(uint)((int)(uVar20 & 0x1fffffff) << 2) * -3);
        if (((int)uVar9 < 0) ||
           (uVar1 = *(uint *)((long)pGVar4 +
                             lVar19 + (ulong)((uint)(uVar20 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar1 < 0)) goto LAB_001dab71;
        iVar8 = Gia_ManHashAnd(p_00,uVar9 ^ (uint)(uVar20 >> 0x1d) & 1,
                               uVar1 ^ (uint)(uVar20 >> 0x3d) & 1);
        *(int *)(&pGVar4->field_0x0 + lVar19) = iVar8;
        iVar8 = p->nObjs;
      }
      lVar18 = lVar18 + 1;
      lVar19 = lVar19 + 0xc;
    } while (lVar18 < iVar8);
  }
  iVar8 = p->nRegs;
  pVVar12 = p->vCos;
  iVar15 = pVVar12->nSize;
  if (iVar8 < iVar15) {
    lVar18 = 0;
    do {
      if (iVar15 <= lVar18) goto LAB_001dab52;
      iVar15 = pVVar12->pArray[lVar18];
      if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) goto LAB_001dab33;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar15;
      if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0)
      goto LAB_001dab71;
      uVar9 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
                                   pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value)
      ;
      pGVar4->Value = uVar9;
      lVar18 = lVar18 + 1;
      iVar8 = p->nRegs;
      pVVar12 = p->vCos;
      iVar15 = pVVar12->nSize;
    } while (lVar18 < iVar15 - iVar8);
  }
  if (0 < nCones) {
    uVar20 = 0;
    do {
      pGVar14 = ppCones[uVar20];
      pVVar12 = pGVar14->vCos;
      uVar9 = pVVar12->nSize;
      if (uVar9 - pGVar14->nRegs != 1) {
        __assert_fail("Gia_ManPoNum(pOne) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                      ,0x482,"Gia_Man_t *Gia_ManDupAppendCones(Gia_Man_t *, Gia_Man_t **, int, int)"
                     );
      }
      if (pGVar14->nRegs != 0) {
        __assert_fail("Gia_ManRegNum(pOne) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                      ,0x483,"Gia_Man_t *Gia_ManDupAppendCones(Gia_Man_t *, Gia_Man_t **, int, int)"
                     );
      }
      pVVar6 = pGVar14->vCis;
      uVar1 = pVVar6->nSize;
      if (fOnlyRegs == 0) {
        if (uVar1 != p->vCis->nSize) {
          __assert_fail("Gia_ManPiNum(pOne) == Gia_ManCiNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                        ,0x487,
                        "Gia_Man_t *Gia_ManDupAppendCones(Gia_Man_t *, Gia_Man_t **, int, int)");
        }
      }
      else if (uVar1 != p->nRegs) {
        __assert_fail("Gia_ManPiNum(pOne) == Gia_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                      ,0x485,"Gia_Man_t *Gia_ManDupAppendCones(Gia_Man_t *, Gia_Man_t **, int, int)"
                     );
      }
      pGVar4 = pGVar14->pObjs;
      pGVar4->Value = 0;
      if ((int)uVar1 < 1) {
        iVar8 = pGVar14->nObjs;
        if (0 < iVar8) goto LAB_001da8f5;
        iVar8 = 0;
      }
      else {
        piVar7 = pVVar6->pArray;
        uVar16 = 0;
        do {
          if (uVar1 == uVar16) goto LAB_001dab52;
          iVar15 = piVar7[uVar16];
          if (((long)iVar15 < 0) || (iVar8 = pGVar14->nObjs, iVar8 <= iVar15)) goto LAB_001dab33;
          uVar9 = (uint)uVar16;
          if (((fOnlyRegs != 0) && (uVar9 = (p->vCis->nSize - p->nRegs) + uVar9, (int)uVar9 < 0)) ||
             (p_00->vCis->nSize <= (int)uVar9)) goto LAB_001dab52;
          iVar2 = p_00->vCis->pArray[uVar9];
          if (((long)iVar2 < 0) || (p_00->nObjs <= iVar2)) goto LAB_001dab33;
          pGVar5 = p_00->pObjs;
          pGVar13 = (Gia_Obj_t *)((ulong)(pGVar5 + iVar2) & 0xfffffffffffffffe);
          if ((pGVar13 < pGVar5) || (pGVar5 + (uint)p_00->nObjs <= pGVar13)) goto LAB_001dab90;
          iVar17 = (int)((ulong)((long)pGVar13 - (long)pGVar5) >> 2);
          if (iVar17 * -0x55555555 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          pGVar4[iVar15].Value = ((uint)(pGVar5 + iVar2) & 1) + iVar17 * 0x55555556;
          uVar16 = uVar16 + 1;
        } while (uVar1 != uVar16);
LAB_001da8f5:
        lVar18 = 8;
        lVar19 = 0;
        do {
          pGVar4 = pGVar14->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          uVar16 = *(ulong *)((long)pGVar4 + lVar18 + -8);
          if ((uVar16 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar16) {
            uVar9 = *(uint *)((long)pGVar4 +
                             lVar18 + (ulong)(uint)((int)(uVar16 & 0x1fffffff) << 2) * -3);
            if (((int)uVar9 < 0) ||
               (uVar1 = *(uint *)((long)pGVar4 +
                                 lVar18 + (ulong)((uint)(uVar16 >> 0x1e) & 0x7ffffffc) * -3),
               (int)uVar1 < 0)) goto LAB_001dab71;
            iVar8 = Gia_ManHashAnd(p_00,uVar9 ^ (uint)(uVar16 >> 0x1d) & 1,
                                   uVar1 ^ (uint)(uVar16 >> 0x3d) & 1);
            *(int *)(&pGVar4->field_0x0 + lVar18) = iVar8;
            iVar8 = pGVar14->nObjs;
          }
          lVar19 = lVar19 + 1;
          lVar18 = lVar18 + 0xc;
        } while (lVar19 < iVar8);
        iVar8 = pGVar14->nRegs;
        pVVar12 = pGVar14->vCos;
        uVar9 = pVVar12->nSize;
      }
      uVar16 = (ulong)uVar9;
      if (iVar8 < (int)uVar9) {
        lVar18 = 0;
        do {
          if ((int)uVar16 <= lVar18) goto LAB_001dab52;
          iVar8 = pVVar12->pArray[lVar18];
          if (((long)iVar8 < 0) || (pGVar14->nObjs <= iVar8)) goto LAB_001dab33;
          if (pGVar14->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar4 = pGVar14->pObjs + iVar8;
          if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0)
          goto LAB_001dab71;
          uVar9 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
                                       pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].
                                       Value);
          pGVar4->Value = uVar9;
          lVar18 = lVar18 + 1;
          pVVar12 = pGVar14->vCos;
          uVar16 = (ulong)pVVar12->nSize;
        } while (lVar18 < (long)(uVar16 - (long)pGVar14->nRegs));
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != (uint)nCones);
    iVar8 = p->nRegs;
  }
  if (0 < iVar8) {
    iVar15 = 0;
    do {
      iVar2 = p->vCos->nSize;
      uVar9 = (iVar2 - iVar8) + iVar15;
      if (((int)uVar9 < 0) || (iVar2 <= (int)uVar9)) {
LAB_001dab52:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar8 = p->vCos->pArray[uVar9];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
LAB_001dab33:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar8;
      if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0) {
LAB_001dab71:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar9 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
                                   pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value)
      ;
      pGVar4->Value = uVar9;
      iVar15 = iVar15 + 1;
      iVar8 = p->nRegs;
    } while (iVar15 < iVar8);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar14 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar14;
}

Assistant:

Gia_Man_t * Gia_ManDupAppendCones( Gia_Man_t * p, Gia_Man_t ** ppCones, int nCones, int fOnlyRegs )
{
    Gia_Man_t * pNew, * pOne;
    Gia_Obj_t * pObj;
    int i, k;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    for ( k = 0; k < nCones; k++ )
    {
        pOne = ppCones[k];
        assert( Gia_ManPoNum(pOne) == 1 );
        assert( Gia_ManRegNum(pOne) == 0 );
        if ( fOnlyRegs )
            assert( Gia_ManPiNum(pOne) == Gia_ManRegNum(p) );
        else
            assert( Gia_ManPiNum(pOne) == Gia_ManCiNum(p) );
        Gia_ManConst0(pOne)->Value = 0;
        Gia_ManForEachPi( pOne, pObj, i )
            pObj->Value = Gia_ManCiLit( pNew, fOnlyRegs ? Gia_ManPiNum(p) + i : i );
        Gia_ManForEachAnd( pOne, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachPo( pOne, pObj, i )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}